

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_graph.cpp
# Opt level: O3

void handlegraph::algorithms::append_path_handle_graph
               (PathHandleGraph *from,MutablePathMutableHandleGraph *into,
               bool only_connect_path_tips)

{
  long lVar1;
  HandleGraph *pHVar2;
  undefined1 uVar3;
  undefined7 in_register_00000011;
  HandleGraph *pHVar4;
  HandleGraph *pHVar5;
  HandleGraph *pHVar6;
  iterator __end3;
  HandleGraph *pHVar7;
  handle_t head;
  handle_t tail;
  handle_t into_head;
  HandleGraph *from_00;
  HandleGraph *g;
  HandleGraph *local_88;
  PathHandleGraph *pPVar8;
  HandleGraph *local_78;
  HandleGraph *local_70;
  HandleGraph *local_68;
  code *local_60;
  _func_int **local_58;
  HandleGraph *local_50;
  MutablePathMutableHandleGraph *local_48;
  HandleGraph local_40;
  MutablePathMutableHandleGraph **local_38;
  
  pHVar5 = (HandleGraph *)0x0;
  g = (HandleGraph *)0x0;
  local_88 = (HandleGraph *)0x0;
  pHVar4 = (HandleGraph *)0x0;
  pHVar7 = (HandleGraph *)0x0;
  from_00 = (HandleGraph *)0x0;
  pPVar8 = from;
  local_48 = into;
  if ((int)CONCAT71(in_register_00000011,only_connect_path_tips) == 0) {
    head_nodes((HandleGraph *)0x0);
    pHVar5 = local_68;
    pHVar4 = local_78;
    local_88 = local_70;
    tail_nodes(g);
    pHVar7 = local_70;
    from_00 = local_78;
    g = local_68;
  }
  copy_handle_graph(from_00,(MutableHandleGraph *)pPVar8);
  pHVar2 = local_50;
  if (pHVar4 != local_88) {
    local_50 = pHVar4;
    from = pPVar8;
    do {
      local_78 = (HandleGraph *)local_50->_vptr_HandleGraph;
      lVar1 = *(long *)(*(long *)into + -0xb0);
      pPVar8 = from;
      local_58 = (_func_int **)
                 (**(code **)(*(long *)((long)&from->field_0x0 + *(long *)(*(long *)from + -0xb0)) +
                             0x20))((long)&from->field_0x0 + *(long *)(*(long *)from + -0xb0),
                                    &local_78);
      uVar3 = (**(code **)(*(long *)((long)&from->field_0x0 + *(long *)(*(long *)from + -0xb0)) +
                          0x28))((long)&from->field_0x0 + *(long *)(*(long *)from + -0xb0),&local_78
                                );
      local_40._vptr_HandleGraph =
           (_func_int **)
           (**(code **)(*(long *)(&into->field_0x0 + lVar1) + 0x18))
                     (&into->field_0x0 + lVar1,&local_58,uVar3);
      from = pPVar8;
      pHVar2 = local_50;
      for (pHVar6 = from_00; pHVar6 != pHVar7; pHVar6 = pHVar6 + 1) {
        local_58 = pHVar6->_vptr_HandleGraph;
        local_50 = pHVar2;
        (**(code **)(*(long *)(&into->field_0x0 + *(long *)(*(long *)into + -0x1d0)) + 0xb0))
                  (&into->field_0x0 + *(long *)(*(long *)into + -0x1d0),&local_58,&local_40);
        pHVar2 = local_50;
      }
      local_50 = pHVar2 + 1;
    } while (local_50 != local_88);
  }
  local_50 = pHVar2;
  local_40._vptr_HandleGraph = (_func_int **)&stack0xffffffffffffff80;
  local_78 = &local_40;
  local_38 = &local_48;
  local_70 = (HandleGraph *)0x0;
  local_60 = std::
             _Function_handler<bool_(const_handlegraph::path_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_68 = (HandleGraph *)
             std::
             _Function_handler<bool_(const_handlegraph::path_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  (**(code **)(*(long *)from + 0x128))(from);
  if (local_68 != (HandleGraph *)0x0) {
    (*(code *)local_68)(&local_78,&local_78,3);
  }
  if (from_00 != (HandleGraph *)0x0) {
    operator_delete(from_00,(long)g - (long)from_00);
  }
  if (pHVar4 != (HandleGraph *)0x0) {
    operator_delete(pHVar4,(long)pHVar5 - (long)pHVar4);
  }
  return;
}

Assistant:

void append_path_handle_graph(const PathHandleGraph* from, MutablePathMutableHandleGraph* into,
                              bool only_connect_path_tips) {

    // get the heads and tails before copying
    vector<handle_t> heads;
    vector<handle_t> tails;
    if (!only_connect_path_tips) {
        heads = algorithms::head_nodes(from);
        tails = algorithms::tail_nodes(into);
    }

    // copy over the nodes and edges
    // beware: no checking duplicates
    copy_handle_graph(from, into);
    
    // connect all the tips
    for (handle_t head : heads) {
        handle_t into_head = into->get_handle(from->get_id(head), from->get_is_reverse(head));
        for (handle_t tail : tails) {
            into->create_edge(tail, into_head);
        }
    }

    // append the paths, adding linking edges
    from->for_each_path_handle([&](const path_handle_t& path_handle) {
            string path_name = from->get_path_name(path_handle);
            if (!into->has_path(path_name)) {
                // just copy it over if it's not there
                copy_path(from, path_handle, into);
            } else {
                // else we append it
                path_handle_t into_path_handle = into->get_path_handle(path_name);
                
                // add the missing edge
                handle_t tail = into->get_handle_of_step(into->path_back(into_path_handle));
                handle_t head = from->get_handle_of_step(from->path_begin(path_handle));
                if (!into->has_edge(tail, head)) {
                    into->create_edge(tail, head);
                }
                
                // append the steps
                from->for_each_step_in_path(path_handle, [&](const step_handle_t& step_handle) {
                        handle_t handle = from->get_handle_of_step(step_handle);
                        handle_t into_handle = into->get_handle(from->get_id(handle), from->get_is_reverse(handle));
                        into->append_step(into_path_handle, into_handle);
                    });
            }                    
        });
    
}